

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

void __thiscall jsonnet::internal::SortImports::sortGroup(SortImports *this,ImportElems *imports)

{
  pointer pIVar1;
  pointer pIVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  
  bVar4 = duplicatedVariables(this,imports);
  if (!bVar4) {
    pIVar1 = (imports->
             super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pIVar2 = (imports->
             super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pIVar1 != pIVar2) {
      uVar5 = ((long)pIVar2 - (long)pIVar1 >> 3) * 0x34f72c234f72c235;
      lVar3 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<jsonnet::internal::SortImports::ImportElem*,std::vector<jsonnet::internal::SortImports::ImportElem,std::allocator<jsonnet::internal::SortImports::ImportElem>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pIVar1,pIVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<jsonnet::internal::SortImports::ImportElem*,std::vector<jsonnet::internal::SortImports::ImportElem,std::allocator<jsonnet::internal::SortImports::ImportElem>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pIVar1,pIVar2);
      return;
    }
  }
  return;
}

Assistant:

void sortGroup(ImportElems &imports)
    {
        // We don't want to change behaviour in such case:
        // local foo = "b.jsonnet";
        // local foo = "a.jsonnet";
        // So we don't change the order when there are shadowed variables.
        if (!duplicatedVariables(imports)) {
            std::sort(imports.begin(), imports.end());
        }
    }